

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  char *pcVar1;
  int iVar2;
  __pid_t _Var3;
  int *piVar4;
  undefined8 extraout_RAX;
  size_t sVar5;
  ostream *poVar6;
  int pipe_fd [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  String local_48;
  GTestLog local_34;
  
  GTestLog::GTestLog(&local_34,GTEST_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x315);
  Message::Message((Message *)&local_50);
  poVar6 = (ostream *)(local_50.ptr_ + 0x10);
  if (local_50.ptr_ == (stringstream *)0x0) {
    poVar6 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"Death tests use fork(), which is unsafe particularly",0x34);
  poVar6 = (ostream *)(local_50.ptr_ + 0x10);
  if (local_50.ptr_ == (stringstream *)0x0) {
    poVar6 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," in a threaded context. For this test, ",0x27);
  poVar6 = (ostream *)(local_50.ptr_ + 0x10);
  if (local_50.ptr_ == (stringstream *)0x0) {
    poVar6 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Google Test",0xb);
  poVar6 = (ostream *)(local_50.ptr_ + 0x10);
  if (local_50.ptr_ == (stringstream *)0x0) {
    poVar6 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = (ostream *)(local_50.ptr_ + 0x10);
  if (local_50.ptr_ == (stringstream *)0x0) {
    poVar6 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"couldn\'t detect the number of threads.",0x26);
  StringStreamToString((internal *)&local_48,local_50.ptr_);
  if (local_50.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_50.ptr_ + 8))();
    local_50.ptr_ = (stringstream *)0x0;
  }
  pcVar1 = local_48.c_str_;
  if (local_48.c_str_ == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(null)",6);
  }
  else if (local_48.length_ != 0) {
    sVar5 = 0;
    do {
      if (pcVar1[sVar5] == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\\0",2);
      }
      else {
        local_50.ptr_._0_1_ = pcVar1[sVar5];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)&local_50,1);
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != local_48.length_);
  }
  if (local_48.c_str_ != (char *)0x0) {
    operator_delete__(local_48.c_str_);
  }
  GTestLog::~GTestLog(&local_34);
  iVar2 = pipe((int *)&local_50);
  if (iVar2 != -1) {
    local_48.c_str_ = (char *)operator_new__(1);
    *local_48.c_str_ = '\0';
    local_48.length_ = 0;
    String::operator=((String *)&DeathTest::last_death_test_message_,&local_48);
    if (local_48.c_str_ != (char *)0x0) {
      operator_delete__(local_48.c_str_);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var3 = fork();
    if (_Var3 == -1) goto LAB_0012c2db;
    *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var3;
    if (_Var3 == 0) goto LAB_0012c22a;
    do {
      iVar2 = close(local_50.ptr_._4_4_);
      if (iVar2 != -1) {
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = (int)local_50.ptr_;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        return OVERSEE_TEST;
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    this = (NoExecDeathTest *)&local_48;
    String::Format((char *)this,"CHECK failed: File %s, line %d: %s != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                   ,0x335,"close(pipe_fd[1])");
    DeathTestAbort((String *)this);
    while (piVar4 = __errno_location(), *piVar4 == 4) {
LAB_0012c22a:
      iVar2 = close((int)local_50.ptr_);
      if (iVar2 != -1) {
        *(int *)&((String *)((long)this + 0x20))->length_ = local_50.ptr_._4_4_;
        UnitTest::GetInstance();
        (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
             false;
        return EXECUTE_TEST;
      }
    }
    String::Format((char *)&local_48,"CHECK failed: File %s, line %d: %s != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                   ,0x32a,"close(pipe_fd[0])");
    DeathTestAbort(&local_48);
  }
  String::Format((char *)&local_48,"CHECK failed: File %s, line %d: %s",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                 ,0x319,"pipe(pipe_fd) != -1");
  DeathTestAbort(&local_48);
LAB_0012c2db:
  String::Format((char *)&local_48,"CHECK failed: File %s, line %d: %s",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                 ,0x327,"child_pid != -1");
  DeathTestAbort(&local_48);
  if (local_48.c_str_ != (char *)0x0) {
    operator_delete__(local_48.c_str_);
  }
  GTestLog::~GTestLog(&local_34);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}